

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain_typed_unittest.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::
ExtendedKeyUsage<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::TestBody
          (ExtendedKeyUsage<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate> *this)

{
  ExtendedKeyUsage<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate> *this_local;
  
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-clientauth/any.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-clientauth/serverauth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-clientauth/clientauth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-clientauth/serverauth-strict.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-clientauth/serverauth-strict-leaf.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-clientauth/clientauth-strict.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-clientauth/clientauth-strict-leaf.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-mlsclientauth/any.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-mlsclientauth/serverauth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-mlsclientauth/clientauth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-mlsclientauth/mlsclientauth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-mlsclientauth-extra/any.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-mlsclientauth-extra/mlsclientauth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-mlsclientauth-extra/any.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-mlsclientauth-extra/mlsclientauth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-c2patimestamping/any.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-c2patimestamping/serverauth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-c2patimestamping/clientauth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-c2patimestamping/c2patimestamp.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-c2patimestamping/c2pamanifest.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-c2pamanifest/any.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-c2pamanifest/serverauth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-c2pamanifest/clientauth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-c2pamanifest/c2patimestamp.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-c2pamanifest/c2pamanifest.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-any-and-clientauth/any.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-any-and-clientauth/serverauth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-any-and-clientauth/serverauth-strict.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-any-and-clientauth/serverauth-strict-leaf.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-any-and-clientauth/clientauth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-any-and-clientauth/clientauth-strict.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-any-and-clientauth/clientauth-strict-leaf.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-clientauth/any.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-clientauth/serverauth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-clientauth/clientauth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-clientauth/serverauth-strict.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-clientauth/clientauth-strict.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-any/any.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-any/serverauth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-any/serverauth-strict-leaf.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-any/clientauth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-any/serverauth-strict.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-any/clientauth-strict.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-any/clientauth-strict-leaf.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-any/mlsclientauth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-many/any.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-many/serverauth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-many/clientauth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-many/serverauth-strict.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-many/serverauth-strict-leaf.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-many/clientauth-strict.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-many/clientauth-strict-leaf.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-many/mlsclientauth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-none/any.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-none/serverauth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-none/clientauth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-none/serverauth-strict.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-none/clientauth-strict.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-none/clientauth-strict-leaf.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-eku-none/mlsclientauth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"root-eku-clientauth/serverauth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"root-eku-clientauth/serverauth-strict.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"root-eku-clientauth/serverauth-ta-with-constraints.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"root-eku-clientauth/serverauth-ta-with-expiration.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"root-eku-clientauth/serverauth-ta-with-expiration-and-constraints.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"root-eku-clientauth/serverauth-ta-with-constraints-strict.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-server-gated-crypto/sha1-eku-any.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-server-gated-crypto/sha1-eku-clientAuth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-server-gated-crypto/sha1-eku-clientAuth-strict.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-server-gated-crypto/sha1-eku-serverAuth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-server-gated-crypto/sha1-eku-serverAuth-strict.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-server-gated-crypto/sha256-eku-any.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-server-gated-crypto/sha256-eku-clientAuth-strict.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-server-gated-crypto/sha256-eku-serverAuth.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-eku-server-gated-crypto/sha256-eku-serverAuth-strict.test");
  return;
}

Assistant:

TYPED_TEST_P(VerifyCertificateChainSingleRootTest, ExtendedKeyUsage) {
  this->RunTest("intermediate-eku-clientauth/any.test");
  this->RunTest("intermediate-eku-clientauth/serverauth.test");
  this->RunTest("intermediate-eku-clientauth/clientauth.test");
  this->RunTest("intermediate-eku-clientauth/serverauth-strict.test");
  this->RunTest("intermediate-eku-clientauth/serverauth-strict-leaf.test");
  this->RunTest("intermediate-eku-clientauth/clientauth-strict.test");
  this->RunTest("intermediate-eku-clientauth/clientauth-strict-leaf.test");
  this->RunTest("intermediate-eku-mlsclientauth/any.test");
  this->RunTest("intermediate-eku-mlsclientauth/serverauth.test");
  this->RunTest("intermediate-eku-mlsclientauth/clientauth.test");
  this->RunTest("intermediate-eku-mlsclientauth/mlsclientauth.test");
  this->RunTest("intermediate-eku-mlsclientauth-extra/any.test");
  this->RunTest("intermediate-eku-mlsclientauth-extra/mlsclientauth.test");
  this->RunTest("intermediate-eku-mlsclientauth-extra/any.test");
  this->RunTest("intermediate-eku-mlsclientauth-extra/mlsclientauth.test");
  this->RunTest("intermediate-eku-c2patimestamping/any.test");
  this->RunTest("intermediate-eku-c2patimestamping/serverauth.test");
  this->RunTest("intermediate-eku-c2patimestamping/clientauth.test");
  this->RunTest("intermediate-eku-c2patimestamping/c2patimestamp.test");
  this->RunTest("intermediate-eku-c2patimestamping/c2pamanifest.test");
  this->RunTest("intermediate-eku-c2pamanifest/any.test");
  this->RunTest("intermediate-eku-c2pamanifest/serverauth.test");
  this->RunTest("intermediate-eku-c2pamanifest/clientauth.test");
  this->RunTest("intermediate-eku-c2pamanifest/c2patimestamp.test");
  this->RunTest("intermediate-eku-c2pamanifest/c2pamanifest.test");
  this->RunTest("intermediate-eku-any-and-clientauth/any.test");
  this->RunTest("intermediate-eku-any-and-clientauth/serverauth.test");
  this->RunTest("intermediate-eku-any-and-clientauth/serverauth-strict.test");
  this->RunTest("intermediate-eku-any-and-clientauth/serverauth-strict-leaf.test");
  this->RunTest("intermediate-eku-any-and-clientauth/clientauth.test");
  this->RunTest("intermediate-eku-any-and-clientauth/clientauth-strict.test");
  this->RunTest("intermediate-eku-any-and-clientauth/clientauth-strict-leaf.test");
  this->RunTest("target-eku-clientauth/any.test");
  this->RunTest("target-eku-clientauth/serverauth.test");
  this->RunTest("target-eku-clientauth/clientauth.test");
  this->RunTest("target-eku-clientauth/serverauth-strict.test");
  this->RunTest("target-eku-clientauth/clientauth-strict.test");
  this->RunTest("target-eku-any/any.test");
  this->RunTest("target-eku-any/serverauth.test");
  this->RunTest("target-eku-any/serverauth-strict-leaf.test");
  this->RunTest("target-eku-any/clientauth.test");
  this->RunTest("target-eku-any/serverauth-strict.test");
  this->RunTest("target-eku-any/clientauth-strict.test");
  this->RunTest("target-eku-any/clientauth-strict-leaf.test");
  this->RunTest("target-eku-any/mlsclientauth.test");
  this->RunTest("target-eku-many/any.test");
  this->RunTest("target-eku-many/serverauth.test");
  this->RunTest("target-eku-many/clientauth.test");
  this->RunTest("target-eku-many/serverauth-strict.test");
  this->RunTest("target-eku-many/serverauth-strict-leaf.test");
  this->RunTest("target-eku-many/clientauth-strict.test");
  this->RunTest("target-eku-many/clientauth-strict-leaf.test");
  this->RunTest("target-eku-many/mlsclientauth.test");
  this->RunTest("target-eku-none/any.test");
  this->RunTest("target-eku-none/serverauth.test");
  this->RunTest("target-eku-none/clientauth.test");
  this->RunTest("target-eku-none/serverauth-strict.test");
  this->RunTest("target-eku-none/clientauth-strict.test");
  this->RunTest("target-eku-none/clientauth-strict-leaf.test");
  this->RunTest("target-eku-none/mlsclientauth.test");
  this->RunTest("root-eku-clientauth/serverauth.test");
  this->RunTest("root-eku-clientauth/serverauth-strict.test");
  this->RunTest("root-eku-clientauth/serverauth-ta-with-constraints.test");
  this->RunTest("root-eku-clientauth/serverauth-ta-with-expiration.test");
  this->RunTest(
      "root-eku-clientauth/serverauth-ta-with-expiration-and-constraints.test");
  this->RunTest(
      "root-eku-clientauth/serverauth-ta-with-constraints-strict.test");
  this->RunTest("intermediate-eku-server-gated-crypto/sha1-eku-any.test");
  this->RunTest(
      "intermediate-eku-server-gated-crypto/sha1-eku-clientAuth.test");
  this->RunTest(
      "intermediate-eku-server-gated-crypto/sha1-eku-clientAuth-strict.test");
  this->RunTest(
      "intermediate-eku-server-gated-crypto/sha1-eku-serverAuth.test");
  this->RunTest(
      "intermediate-eku-server-gated-crypto/sha1-eku-serverAuth-strict.test");
  this->RunTest("intermediate-eku-server-gated-crypto/sha256-eku-any.test");
  this->RunTest(
      "intermediate-eku-server-gated-crypto/sha256-eku-clientAuth-strict.test");
  this->RunTest(
      "intermediate-eku-server-gated-crypto/sha256-eku-serverAuth.test");
  this->RunTest(
      "intermediate-eku-server-gated-crypto/sha256-eku-serverAuth-strict.test");
}